

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_copyWithin(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  byte bVar1;
  int max;
  int iVar2;
  ulong uVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  JSValue JVar7;
  JSValue val;
  int final;
  int from;
  int to;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  JSValueUnion local_40;
  
  iVar4 = this_val.tag;
  JVar5 = this_val.u;
  local_40 = JVar5;
  max = js_typed_array_get_length_internal(ctx,this_val);
  if ((((max < 0) ||
       (local_4c = argc, iVar2 = JS_ToInt32Clamp(ctx,&local_44,*argv,0,max,max), iVar2 != 0)) ||
      (iVar2 = JS_ToInt32Clamp(ctx,&local_48,argv[1],0,max,max), iVar2 != 0)) ||
     (((local_50 = max, 2 < local_4c && ((int)argv[2].tag != 3)) &&
      (val.tag = argv[2].tag, val.u.ptr = argv[2].u.ptr,
      iVar2 = JS_ToInt32Clamp(ctx,&local_50,val,0,max,max), iVar2 != 0)))) {
LAB_0016eea0:
    uVar6 = 0;
    uVar3 = 0;
    iVar4 = 6;
  }
  else {
    iVar2 = max - local_44;
    if (local_50 - local_48 < max - local_44) {
      iVar2 = local_50 - local_48;
    }
    if (0 < iVar2) {
      if (*(char *)(*(long *)(*(long *)(*(long *)((long)local_40.ptr + 0x30) + 0x18) + 0x30) + 4) !=
          '\0') {
        JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
        goto LAB_0016eea0;
      }
      bVar1 = "includes"[(ulong)*(ushort *)((long)local_40.ptr + 6) + 1];
      memmove((void *)((long)(local_44 << (bVar1 & 0x1f)) + *(long *)((long)local_40.ptr + 0x38)),
              (void *)((long)(local_48 << (bVar1 & 0x1f)) + *(long *)((long)local_40.ptr + 0x38)),
              (long)(iVar2 << (bVar1 & 0x1f)));
    }
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar5.ptr = *JVar5.ptr + 1;
    }
    uVar3 = (ulong)JVar5.ptr & 0xffffffff00000000;
    uVar6 = (ulong)JVar5.ptr & 0xffffffff;
  }
  JVar7.tag = iVar4;
  JVar7.u.ptr = (void *)(uVar6 | uVar3);
  return JVar7;
}

Assistant:

static JSValue js_typed_array_copyWithin(JSContext *ctx, JSValueConst this_val,
                                         int argc, JSValueConst *argv)
{
    JSObject *p;
    int len, to, from, final, count, shift;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;

    if (JS_ToInt32Clamp(ctx, &to, argv[0], 0, len, len))
        return JS_EXCEPTION;

    if (JS_ToInt32Clamp(ctx, &from, argv[1], 0, len, len))
        return JS_EXCEPTION;

    final = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[2], 0, len, len))
            return JS_EXCEPTION;
    }

    count = min_int(final - from, len - to);
    if (count > 0) {
        p = JS_VALUE_GET_OBJ(this_val);
        if (typed_array_is_detached(ctx, p))
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        shift = typed_array_size_log2(p->class_id);
        memmove(p->u.array.u.uint8_ptr + (to << shift),
                p->u.array.u.uint8_ptr + (from << shift),
                count << shift);
    }
    return JS_DupValue(ctx, this_val);
}